

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImU32 IVar1;
  value_type *pvVar2;
  ImVector<ImGuiSettingsHandler> *this;
  int i;
  
  this = &GImGui->SettingsHandlers;
  i = 0;
  IVar1 = ImHash(type_name,0,0);
  while( true ) {
    if (this->Size <= i) {
      return (ImGuiSettingsHandler *)0x0;
    }
    pvVar2 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
    if (pvVar2->TypeHash == IVar1) break;
    i = i + 1;
  }
  pvVar2 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
  return pvVar2;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHash(type_name, 0, 0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].TypeHash == type_hash)
            return &g.SettingsHandlers[handler_n];
    return NULL;
}